

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::computeWeekFields(Calendar *this,UErrorCode *ec)

{
  int dayOfWeek_00;
  int iVar1;
  UBool UVar2;
  byte bVar3;
  EDaysOfWeek EVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  int local_40;
  int32_t dayOfMonth;
  int32_t lastRelDow;
  int32_t lastDoy;
  int32_t prevDoy;
  int32_t woy;
  int32_t relDowJan1;
  int32_t relDow;
  int32_t yearOfWeekOfYear;
  int32_t dayOfYear;
  int32_t dayOfWeek;
  int32_t eyear;
  UErrorCode *ec_local;
  Calendar *this_local;
  
  UVar2 = ::U_FAILURE(*ec);
  if (UVar2 == '\0') {
    relDowJan1 = this->fFields[0x13];
    dayOfWeek_00 = this->fFields[7];
    iVar1 = this->fFields[6];
    EVar4 = getFirstDayOfWeek(this);
    iVar6 = (int)((dayOfWeek_00 + 7) - EVar4) % 7;
    EVar4 = getFirstDayOfWeek(this);
    iVar7 = (int)(((dayOfWeek_00 - iVar1) + 0x1b59) - EVar4) % 7;
    lastDoy = (iVar1 + -1 + iVar7) / 7;
    bVar3 = getMinimalDaysInFirstWeek(this);
    if ((int)(uint)bVar3 <= 7 - iVar7) {
      lastDoy = lastDoy + 1;
    }
    if (lastDoy == 0) {
      iVar6 = (*(this->super_UObject)._vptr_UObject[0x23])(this,(ulong)(relDowJan1 - 1));
      lastDoy = weekNumber(this,iVar1 + iVar6,dayOfWeek_00);
      relDowJan1 = relDowJan1 - 1;
    }
    else {
      iVar7 = (*(this->super_UObject)._vptr_UObject[0x23])(this,(ulong)(uint)relDowJan1);
      if (iVar7 + -5 <= iVar1) {
        local_40 = ((iVar6 + iVar7) - iVar1) % 7;
        if (local_40 < 0) {
          local_40 = local_40 + 7;
        }
        bVar3 = getMinimalDaysInFirstWeek(this);
        if (((int)(uint)bVar3 <= 6 - local_40) && (iVar7 < (iVar1 + 7) - iVar6)) {
          lastDoy = 1;
          relDowJan1 = relDowJan1 + 1;
        }
      }
    }
    this->fFields[3] = lastDoy;
    this->fFields[0x11] = relDowJan1;
    iVar1 = this->fFields[5];
    iVar5 = weekNumber(this,iVar1,dayOfWeek_00);
    this->fFields[4] = iVar5;
    this->fFields[8] = (iVar1 + -1) / 7 + 1;
  }
  return;
}

Assistant:

void Calendar::computeWeekFields(UErrorCode &ec) {
    if(U_FAILURE(ec)) {
        return;
    }
    int32_t eyear = fFields[UCAL_EXTENDED_YEAR];
    int32_t dayOfWeek = fFields[UCAL_DAY_OF_WEEK];
    int32_t dayOfYear = fFields[UCAL_DAY_OF_YEAR];

    // WEEK_OF_YEAR start
    // Compute the week of the year.  For the Gregorian calendar, valid week
    // numbers run from 1 to 52 or 53, depending on the year, the first day
    // of the week, and the minimal days in the first week.  For other
    // calendars, the valid range may be different -- it depends on the year
    // length.  Days at the start of the year may fall into the last week of
    // the previous year; days at the end of the year may fall into the
    // first week of the next year.  ASSUME that the year length is less than
    // 7000 days.
    int32_t yearOfWeekOfYear = eyear;
    int32_t relDow = (dayOfWeek + 7 - getFirstDayOfWeek()) % 7; // 0..6
    int32_t relDowJan1 = (dayOfWeek - dayOfYear + 7001 - getFirstDayOfWeek()) % 7; // 0..6
    int32_t woy = (dayOfYear - 1 + relDowJan1) / 7; // 0..53
    if ((7 - relDowJan1) >= getMinimalDaysInFirstWeek()) {
        ++woy;
    }

    // Adjust for weeks at the year end that overlap into the previous or
    // next calendar year.
    if (woy == 0) {
        // We are the last week of the previous year.
        // Check to see if we are in the last week; if so, we need
        // to handle the case in which we are the first week of the
        // next year.

        int32_t prevDoy = dayOfYear + handleGetYearLength(eyear - 1);
        woy = weekNumber(prevDoy, dayOfWeek);
        yearOfWeekOfYear--;
    } else {
        int32_t lastDoy = handleGetYearLength(eyear);
        // Fast check: For it to be week 1 of the next year, the DOY
        // must be on or after L-5, where L is yearLength(), then it
        // cannot possibly be week 1 of the next year:
        //          L-5                  L
        // doy: 359 360 361 362 363 364 365 001
        // dow:      1   2   3   4   5   6   7
        if (dayOfYear >= (lastDoy - 5)) {
            int32_t lastRelDow = (relDow + lastDoy - dayOfYear) % 7;
            if (lastRelDow < 0) {
                lastRelDow += 7;
            }
            if (((6 - lastRelDow) >= getMinimalDaysInFirstWeek()) &&
                ((dayOfYear + 7 - relDow) > lastDoy)) {
                    woy = 1;
                    yearOfWeekOfYear++;
                }
        }
    }
    fFields[UCAL_WEEK_OF_YEAR] = woy;
    fFields[UCAL_YEAR_WOY] = yearOfWeekOfYear;
    // WEEK_OF_YEAR end

    int32_t dayOfMonth = fFields[UCAL_DAY_OF_MONTH];
    fFields[UCAL_WEEK_OF_MONTH] = weekNumber(dayOfMonth, dayOfWeek);
    fFields[UCAL_DAY_OF_WEEK_IN_MONTH] = (dayOfMonth-1) / 7 + 1;
#if defined (U_DEBUG_CAL)
    if(fFields[UCAL_DAY_OF_WEEK_IN_MONTH]==0) fprintf(stderr, "%s:%d: DOWIM %d on %g\n",
        __FILE__, __LINE__,fFields[UCAL_DAY_OF_WEEK_IN_MONTH], fTime);
#endif
}